

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

RealType __thiscall
OpenMD::ElementsTable::CorrectedBondRad(ElementsTable *this,int atomicnum,int hyb)

{
  size_type sVar1;
  reference ppEVar2;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  RealType rad;
  ElementsTable *in_stack_000080c0;
  RealType local_20;
  RealType local_8;
  
  if ((*in_RDI & 1) == 0) {
    Init(in_stack_000080c0);
  }
  if ((in_ESI < 0) ||
     (sVar1 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::size
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RDI + 0x88)), (int)sVar1 <= in_ESI)) {
    local_8 = 1.0;
  }
  else {
    ppEVar2 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RDI + 0x88),(long)in_ESI);
    local_20 = Element::GetCovalentRad(*ppEVar2);
    if (in_EDX == 2) {
      local_20 = local_20 * 0.95;
    }
    else if (in_EDX == 1) {
      local_20 = local_20 * 0.9;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

RealType ElementsTable::CorrectedBondRad(int atomicnum, int hyb) {
    RealType rad;
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return (1.0);

    rad = elements_[atomicnum]->GetCovalentRad();

    if (hyb == 2)
      rad *= 0.95;
    else if (hyb == 1)
      rad *= 0.90;

    return (rad);
  }